

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader_database.cpp
# Opt level: O0

void add_shader_program(GLuint p_id,vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders)

{
  ShaderProgram local_50;
  pair<unsigned_int,_ShaderProgram> local_38;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_18;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *p_shaders_local;
  GLuint p_id_local;
  
  local_18 = p_shaders;
  p_shaders_local._4_4_ = p_id;
  ShaderProgram::ShaderProgram(&local_50,p_shaders);
  std::make_pair<unsigned_int_const&,ShaderProgram>
            (&local_38,(uint *)((long)&p_shaders_local + 4),&local_50);
  std::
  unordered_map<unsigned_int,ShaderProgram,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ShaderProgram>>>
  ::emplace<std::pair<unsigned_int,ShaderProgram>>
            ((unordered_map<unsigned_int,ShaderProgram,std::hash<unsigned_int>,std::equal_to<unsigned_int>,std::allocator<std::pair<unsigned_int_const,ShaderProgram>>>
              *)ShaderDb::program_map,&local_38);
  std::pair<unsigned_int,_ShaderProgram>::~pair(&local_38);
  ShaderProgram::~ShaderProgram(&local_50);
  return;
}

Assistant:

void add_shader_program(
    const GLuint p_id,
    const std::vector<GLuint> &p_shaders) noexcept
{
    ShaderDb::program_map.emplace(
        std::make_pair(
            p_id,
            ShaderProgram(p_shaders)));
}